

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O3

string * __thiscall
grpc_java_generator::GenerateServiceSource_abi_cxx11_
          (string *__return_storage_ptr__,grpc_java_generator *this,File *file,Service *service,
          Parameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Printer *pPVar4;
  mapped_type *pmVar5;
  undefined1 disable_version;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  VARS vars;
  key_type local_d8;
  key_type local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  Printer *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  File *local_58;
  key_type local_50;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (**(code **)(*(long *)this + 0x60))(&local_68,this,__return_storage_ptr__);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = file;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"25.2.10","");
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"flatc_version","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  (**(code **)(*(long *)this + 0x28))(&local_d8,this);
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"file_name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if (service[1].super_CommentHolder._vptr_CommentHolder != (_func_int **)0x0) {
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Package","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_98,&local_d8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT17(local_d8.field_2._M_local_buf[7],
                               CONCAT16(local_d8.field_2._M_local_buf[6],
                                        CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                                 local_d8.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
  }
  pPVar4 = local_68;
  (**(code **)(*(long *)this + 0x28))(&local_d8,this);
  local_b8.field_2._M_allocated_capacity = 0x656d616e656c6966;
  local_b8._M_string_length = 8;
  local_b8.field_2._M_local_buf[8] = '\0';
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  (*pPVar4->_vptr_Printer[2])
            (pPVar4,&local_98,"//Generated by flatc compiler (version $flatc_version$)\n");
  (*pPVar4->_vptr_Printer[3])(pPVar4,"//If you make any local changes, they will be lost\n");
  (*pPVar4->_vptr_Printer[2])(pPVar4,&local_98,"//source: $filename$.fbs\n\n");
  (*pPVar4->_vptr_Printer[2])(pPVar4,&local_98,"package $Package$;\n\n");
  local_b8._M_string_length = 7;
  local_b8.field_2._M_allocated_capacity = 0x6567616b636150;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_b8);
  pcVar3 = (pmVar5->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + pmVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6b636150;
  local_50._M_string_length = 7;
  local_50.field_2._M_allocated_capacity._4_4_ = 0x656761;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_50);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                             local_50.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*(long *)this + 0x48))(&local_d8,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if (local_d8._M_string_length != 0) {
    (**(code **)(*(long *)this + 0x48))(&local_d8,this);
    (*pPVar4->_vptr_Printer[3])(pPVar4,local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT17(local_d8.field_2._M_local_buf[7],
                               CONCAT16(local_d8.field_2._M_local_buf[6],
                                        CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                                 local_d8.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    (*pPVar4->_vptr_Printer[3])(pPVar4,"\n\n");
  }
  pPVar4 = local_68;
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x69727453;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x676e;
  local_d8._M_string_length = 6;
  local_d8.field_2._M_local_buf[6] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38733d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x72706544;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6365;
  local_d8.field_2._M_local_buf[6] = 'a';
  local_d8.field_2._M_local_buf[7] = 't';
  local_d8.field_2._M_local_buf[8] = 'e';
  local_d8.field_2._M_local_buf[9] = 'd';
  local_d8._M_string_length = 10;
  local_d8.field_2._M_local_buf[10] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38734e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x7265764f;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6972;
  local_d8.field_2._M_local_buf[6] = 'd';
  local_d8.field_2._M_local_buf[7] = 'e';
  local_d8._M_string_length = 8;
  local_d8.field_2._M_local_buf[8] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x387363);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x6e616843;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x656e;
  local_d8.field_2._M_local_buf[6] = 'l';
  local_d8._M_string_length = 7;
  local_d8.field_2._M_local_buf[7] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x387376);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x6c6c6143;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x704f;
  local_d8.field_2._M_local_buf[6] = 't';
  local_d8.field_2._M_local_buf[7] = 'i';
  local_d8.field_2._M_local_buf[8] = 'o';
  local_d8.field_2._M_local_buf[9] = 'n';
  local_d8.field_2._M_local_buf[10] = 's';
  local_d8._M_string_length = 0xb;
  local_d8.field_2._M_local_buf[0xb] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x387386);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x6874654d;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x646f;
  local_d8.field_2._M_local_buf[6] = 'T';
  local_d8.field_2._M_local_buf[7] = 'y';
  local_d8.field_2._M_local_buf[8] = 'p';
  local_d8.field_2._M_local_buf[9] = 'e';
  local_d8._M_string_length = 10;
  local_d8.field_2._M_local_buf[10] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38739a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x16;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ServerMethodDefinition",0x16);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x3873be);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x646e6942;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6261;
  local_d8.field_2._M_local_buf[6] = 'l';
  local_d8.field_2._M_local_buf[7] = 'e';
  local_d8.field_2._M_local_buf[8] = 'S';
  local_d8.field_2._M_local_buf[9] = 'e';
  local_d8.field_2._M_local_buf[10] = 'r';
  local_d8.field_2._M_local_buf[0xb] = 'v';
  local_d8.field_2._M_local_buf[0xc] = 'i';
  local_d8.field_2._M_local_buf[0xd] = 'c';
  local_d8.field_2._M_local_buf[0xe] = 'e';
  local_d8._M_string_length = 0xf;
  local_d8.field_2._M_local_buf[0xf] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x3873dd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x17;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ServerServiceDefinition",0x17);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x3873f5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x11;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ServiceDescriptor",0x11);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x387415);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x1b;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ProtoFileDescriptorSupplier",0x1b);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38742f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x1e;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ProtoServiceDescriptorSupplier",0x1e);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38745c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x1d;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ProtoMethodDescriptorSupplier",0x1d);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38748c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x74736241;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6172;
  local_d8.field_2._M_local_buf[6] = 'c';
  local_d8.field_2._M_local_buf[7] = 't';
  local_d8.field_2._M_local_buf[8] = 'S';
  local_d8.field_2._M_local_buf[9] = 't';
  local_d8.field_2._M_local_buf[10] = 'u';
  local_d8.field_2._M_local_buf[0xb] = 'b';
  local_d8._M_string_length = 0xc;
  local_d8.field_2._M_local_buf[0xc] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x3874bb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"MethodDescriptor",0x10);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x3874d5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x6f6e614e;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x7455;
  local_d8.field_2._M_local_buf[6] = 'i';
  local_d8.field_2._M_local_buf[7] = 'l';
  local_d8.field_2._M_local_buf[8] = 's';
  local_d8.field_2._M_local_buf[9] = '\0';
  local_d8._M_string_length = 9;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x3874ee);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x65727453;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6d61;
  local_d8.field_2._M_local_buf[6] = 'O';
  local_d8.field_2._M_local_buf[7] = 'b';
  local_d8.field_2._M_local_buf[8] = 's';
  local_d8.field_2._M_local_buf[9] = 'e';
  local_d8.field_2._M_local_buf[10] = 'r';
  local_d8.field_2._M_local_buf[0xb] = 'v';
  local_d8.field_2._M_local_buf[0xc] = 'e';
  local_d8.field_2._M_local_buf[0xd] = 'r';
  local_d8._M_string_length = 0xe;
  local_d8.field_2._M_local_buf[0xe] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38750e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x72657449;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x7461;
  local_d8.field_2._M_local_buf[6] = 'o';
  local_d8.field_2._M_local_buf[7] = 'r';
  local_d8._M_string_length = 8;
  local_d8.field_2._M_local_buf[8] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38752a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x656e6547;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6172;
  local_d8.field_2._M_local_buf[6] = 't';
  local_d8.field_2._M_local_buf[7] = 'e';
  local_d8.field_2._M_local_buf[8] = 'd';
  local_d8.field_2._M_local_buf[9] = '\0';
  local_d8._M_string_length = 9;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38753d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x10;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_b8);
  local_d8.field_2._M_allocated_capacity._0_4_ = SUB84(local_b8._M_dataplus._M_p,0);
  local_d8.field_2._M_allocated_capacity._4_2_ =
       (undefined2)((ulong)local_b8._M_dataplus._M_p >> 0x20);
  local_d8.field_2._M_local_buf[6] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x30);
  local_d8.field_2._M_local_buf[7] = (char)((ulong)local_b8._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_d8._M_dataplus._M_p,"ListenableFuture",0x10);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[(long)local_b8._M_dataplus._M_p] = '\0';
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x387558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x65707845;
  local_d8.field_2._M_allocated_capacity._4_2_ = 0x6972;
  local_d8.field_2._M_local_buf[6] = 'm';
  local_d8.field_2._M_local_buf[7] = 'e';
  local_d8.field_2._M_local_buf[8] = 'n';
  local_d8.field_2._M_local_buf[9] = 't';
  local_d8.field_2._M_local_buf[10] = 'a';
  local_d8.field_2._M_local_buf[0xb] = 'l';
  local_d8.field_2._M_local_buf[0xc] = 'A';
  local_d8.field_2._M_local_buf[0xd] = 'p';
  local_d8.field_2._M_local_buf[0xe] = 'i';
  local_d8._M_string_length = 0xf;
  local_d8.field_2._M_local_buf[0xf] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_98,&local_d8);
  disable_version = 0x8b;
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x38758b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT17(local_d8.field_2._M_local_buf[7],
                             CONCAT16(local_d8.field_2._M_local_buf[6],
                                      CONCAT24(local_d8.field_2._M_allocated_capacity._4_2_,
                                               local_d8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  (*pPVar4->_vptr_Printer[3])
            (pPVar4,
             "import java.nio.ByteBuffer;\nimport static io.grpc.MethodDescriptor.generateFullMethodName;\nimport static io.grpc.stub.ClientCalls.asyncBidiStreamingCall;\nimport static io.grpc.stub.ClientCalls.asyncClientStreamingCall;\nimport static io.grpc.stub.ClientCalls.asyncServerStreamingCall;\nimport static io.grpc.stub.ClientCalls.asyncUnaryCall;\nimport static io.grpc.stub.ClientCalls.blockingServerStreamingCall;\nimport static io.grpc.stub.ClientCalls.blockingUnaryCall;\nimport static io.grpc.stub.ClientCalls.futureUnaryCall;\nimport static io.grpc.stub.ServerCalls.asyncBidiStreamingCall;\nimport static io.grpc.stub.ServerCalls.asyncClientStreamingCall;\nimport static io.grpc.stub.ServerCalls.asyncServerStreamingCall;\nimport static io.grpc.stub.ServerCalls.asyncUnaryCall;\nimport static io.grpc.stub.ServerCalls.asyncUnimplementedStreamingCall;\nimport static io.grpc.stub.ServerCalls.asyncUnimplementedUnaryCall;\n\n"
            );
  anon_unknown_0::PrintService
            (pPVar4,(VARS *)&local_98,(ServiceDescriptor *)local_58,(bool)disable_version);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98);
  if (local_68 != (Printer *)0x0) {
    (*local_68->_vptr_Printer[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

grpc::string GenerateServiceSource(
    grpc_generator::File *file, const grpc_generator::Service *service,
    grpc_java_generator::Parameters *parameters) {
  grpc::string out;
  auto printer = file->CreatePrinter(&out);
  VARS vars;
  vars["flatc_version"] = grpc::string(
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MAJOR) "." FLATBUFFERS_STRING(
          FLATBUFFERS_VERSION_MINOR) "." FLATBUFFERS_STRING(FLATBUFFERS_VERSION_REVISION));

  vars["file_name"] = file->filename();

  if (!parameters->package_name.empty()) {
    vars["Package"] = parameters->package_name;  // ServiceJavaPackage(service);
  }
  GenerateImports(file, &*printer, vars);
  GenerateService(service, &*printer, vars, false);
  return out;
}